

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

int lws_mqtt_pconsume(lws_mqtt_parser_t *par,int consumed)

{
  int iVar1;
  lws_mqtt_packet_parse_state_t lVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = consumed + par->consumed;
  par->consumed = uVar4;
  iVar1 = -1;
  uVar3 = par->props_len;
  if (uVar3 > uVar4 || uVar4 == uVar3) {
    lVar2 = LMQCPP_PROP_ID_VBI;
    if (uVar3 <= uVar4) {
      uVar3 = (uint)(par->packet_type_flags >> 4);
      if (((0xf0f5U >> uVar3 & 1) != 0) ||
         (lVar2 = LMQCPP_PAYLOAD, (par->packet_type_flags & 6) == 0 && uVar3 == 3)) {
        lVar2 = LMQCPP_IDLE;
      }
    }
    par->state = lVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
lws_mqtt_pconsume(lws_mqtt_parser_t *par, int consumed)
{
	par->consumed += consumed;

	if (par->consumed > par->props_len)
		return -1;

	/* more properties coming */

	if (par->consumed < par->props_len) {
		par->state = LMQCPP_PROP_ID_VBI;
		return 0;
	}

	/* properties finished: are we headed for payload or idle? */

	if ((map_flags[ctl_pkt_type(par)] & LMQCP_LUT_FLAG_PAYLOAD) &&
		/* A PUBLISH packet MUST NOT contain a Packet Identifier if
		 * its QoS value is set to 0 [MQTT-2.2.1-2]. */
	    (ctl_pkt_type(par) != LMQCP_PUBLISH ||
	     (par->packet_type_flags & 6))) {
		par->state = LMQCPP_PAYLOAD;
		return 0;
	}

	par->state = LMQCPP_IDLE;

	return 0;
}